

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86IntelInstPrinter.c
# Opt level: O0

void printDstIdx(MCInst *MI,uint Op,SStream *O)

{
  uint8_t *puVar1;
  SStream *in_RDX;
  undefined4 in_ESI;
  MCInst *in_RDI;
  cs_struct *unaff_retaddr;
  uint8_t access [6];
  cs_struct *in_stack_ffffffffffffffd8;
  SStream *in_stack_ffffffffffffffe0;
  undefined4 in_stack_fffffffffffffff0;
  
  if (in_RDI->csh->detail != CS_OPT_OFF) {
    puVar1 = in_RDI->flat_insn->detail->groups +
             (ulong)(in_RDI->flat_insn->detail->field_6).x86.op_count * 0x30 + 0x55;
    puVar1[0] = '\x03';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    in_RDI->flat_insn->detail->groups
    [(ulong)(in_RDI->flat_insn->detail->field_6).x86.op_count * 0x30 + 0x75] = in_RDI->x86opsize;
    puVar1 = in_RDI->flat_insn->detail->groups +
             (ulong)(in_RDI->flat_insn->detail->field_6).x86.op_count * 0x30 + 0x5d;
    puVar1[0] = '\0';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    puVar1 = in_RDI->flat_insn->detail->groups +
             (ulong)(in_RDI->flat_insn->detail->field_6).x86.op_count * 0x30 + 0x61;
    puVar1[0] = '\0';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    puVar1 = in_RDI->flat_insn->detail->groups +
             (ulong)(in_RDI->flat_insn->detail->field_6).x86.op_count * 0x30 + 0x65;
    puVar1[0] = '\0';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    puVar1 = in_RDI->flat_insn->detail->groups +
             (ulong)(in_RDI->flat_insn->detail->field_6).x86.op_count * 0x30 + 0x69;
    puVar1[0] = '\x01';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    puVar1 = in_RDI->flat_insn->detail->groups +
             (ulong)(in_RDI->flat_insn->detail->field_6).x86.op_count * 0x30 + 0x6d;
    puVar1[0] = '\0';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    puVar1[4] = '\0';
    puVar1[5] = '\0';
    puVar1[6] = '\0';
    puVar1[7] = '\0';
    in_stack_ffffffffffffffd8 = in_RDI->csh;
    MCInst_getOpcode(in_RDI);
    get_op_access(unaff_retaddr,(uint)((ulong)in_RDI >> 0x20),
                  (uint8_t *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),(uint64_t *)in_RDX);
    in_RDI->flat_insn->detail->groups
    [(ulong)(in_RDI->flat_insn->detail->field_6).x86.op_count * 0x30 + 0x76] =
         (&stack0xffffffffffffffe2)[(in_RDI->flat_insn->detail->field_6).x86.op_count];
  }
  if (in_RDI->csh->mode == CS_MODE_64) {
    SStream_concat(in_RDX,"[");
  }
  else {
    SStream_concat(in_RDX,"es:[");
    if (in_RDI->csh->detail != CS_OPT_OFF) {
      puVar1 = in_RDI->flat_insn->detail->groups +
               (ulong)(in_RDI->flat_insn->detail->field_6).x86.op_count * 0x30 + 0x5d;
      puVar1[0] = '\x1c';
      puVar1[1] = '\0';
      puVar1[2] = '\0';
      puVar1[3] = '\0';
    }
  }
  set_mem_access(in_RDI,true);
  printOperand(MI,Op,O);
  SStream_concat0(in_stack_ffffffffffffffe0,(char *)in_stack_ffffffffffffffd8);
  set_mem_access(in_RDI,false);
  return;
}

Assistant:

static void printDstIdx(MCInst *MI, unsigned Op, SStream *O)
{
	if (MI->csh->detail) {
#ifndef CAPSTONE_DIET
		uint8_t access[6];
#endif

		MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].type = X86_OP_MEM;
		MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].size = MI->x86opsize;
		MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].mem.segment = X86_REG_INVALID;
		MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].mem.base = X86_REG_INVALID;
		MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].mem.index = X86_REG_INVALID;
		MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].mem.scale = 1;
		MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].mem.disp = 0;

#ifndef CAPSTONE_DIET
		get_op_access(MI->csh, MCInst_getOpcode(MI), access, &MI->flat_insn->detail->x86.eflags);
		MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].access = access[MI->flat_insn->detail->x86.op_count];
#endif
	}

	// DI accesses are always ES-based on non-64bit mode
	if (MI->csh->mode != CS_MODE_64) {
		SStream_concat(O, "es:[");
		if (MI->csh->detail) {
			MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].mem.segment = X86_REG_ES;
		}
	} else
		SStream_concat(O, "[");

	set_mem_access(MI, true);
	printOperand(MI, Op, O);
	SStream_concat0(O, "]");
	set_mem_access(MI, false);
}